

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *pObj,int fThisIsPivot)

{
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *p_00;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar2 != 3) {
    if (uVar2 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                    ,0xa36,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
    }
    if (fThisIsPivot != 0) {
      p = pObj->pNtk->vTopo;
      Vec_IntWriteEntry(p,pObj->Id * 2,p->nSize);
    }
    lVar4 = 0;
    do {
      if ((pObj->vFanouts).nSize <= lVar4) {
        p_00 = (Abc_Obj_t *)0x0;
        goto LAB_001ec094;
      }
      p_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]];
      iVar1 = Abc_NtkTopoHasBeg(p_00);
      lVar4 = lVar4 + 1;
    } while (iVar1 != 0);
    iVar1 = Vec_IntEntry(p_00->pNtk->vTopo,p_00->Id * 2 + 1);
    if (iVar1 != 0) {
      __assert_fail("!Abc_NtkTopoHasEnd(pNext)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                    ,0xa3e,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
    }
    Abc_NtkReverseTopoOrder_rec(p_00,1);
LAB_001ec094:
    for (lVar4 = 0; pAVar3 = pObj->pNtk, lVar4 < (pObj->vFanouts).nSize; lVar4 = lVar4 + 1) {
      pObj_00 = (Abc_Obj_t *)pAVar3->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]];
      if (pObj_00 != p_00) {
        Abc_NtkReverseTopoOrder_rec(pObj_00,0);
      }
    }
    if (fThisIsPivot == 0) goto LAB_001ec0e8;
    Vec_IntWriteEntry(pAVar3->vTopo,pObj->Id * 2 + 1,pAVar3->vTopo->nSize);
  }
  pAVar3 = pObj->pNtk;
LAB_001ec0e8:
  Vec_IntPush(pAVar3->vTopo,pObj->Id);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder_rec( Abc_Obj_t * pObj, int fThisIsPivot )
{
    Abc_Obj_t * pNext, * pPivot = NULL;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsPo(pObj) )
    {
        Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // mark begining
    if ( fThisIsPivot )
        Abc_NtkTopoSetBeg( pObj );        
    // find fanout without topo
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( !Abc_NtkTopoHasBeg(pNext) )
        { 
            assert( !Abc_NtkTopoHasEnd(pNext) );
            Abc_NtkReverseTopoOrder_rec( pNext, 1 );
            pPivot = pNext;
            break;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext != pPivot )
            Abc_NtkReverseTopoOrder_rec( pNext, 0 );
    // mark end
    if ( fThisIsPivot )
        Abc_NtkTopoSetEnd( pObj );
    // save current node        
    Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
}